

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O1

void duckdb::NumericStats::TemplatedVerify<unsigned_short>
               (BaseStatistics *stats,Vector *vector,SelectionVector *sel,idx_t count)

{
  uint16_t uVar1;
  InternalException *pIVar2;
  idx_t iVar3;
  idx_t iVar4;
  UnifiedVectorFormat vdata;
  Value max_value;
  Value min_value;
  string local_198;
  UnifiedVectorFormat local_178;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  Value local_b0;
  Value local_70;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_178);
  Vector::ToUnifiedFormat(vector,count,&local_178);
  MinOrNull(&local_70,stats);
  MaxOrNull(&local_b0,stats);
  if (count != 0) {
    iVar4 = 0;
    do {
      iVar3 = iVar4;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar3 = (idx_t)sel->sel_vector[iVar4];
      }
      if ((local_178.sel)->sel_vector != (sel_t *)0x0) {
        iVar3 = (idx_t)(local_178.sel)->sel_vector[iVar3];
      }
      if ((local_178.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_178.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar3 >> 6]
           >> (iVar3 & 0x3f) & 1) != 0)) {
        if (local_70.is_null == false) {
          uVar1 = Value::GetValueUnsafe<unsigned_short>(&local_70);
          if (*(ushort *)(local_178.data + iVar3 * 2) < uVar1) {
            pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_198,
                       "Statistics mismatch: value is smaller than min.\nStatistics: %s\nVector: %s"
                       ,"");
            BaseStatistics::ToString_abi_cxx11_(&local_d0,stats);
            Vector::ToString_abi_cxx11_(&local_f0,vector,count);
            InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                      (pIVar2,&local_198,&local_d0,&local_f0);
            __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        if (local_b0.is_null == false) {
          uVar1 = Value::GetValueUnsafe<unsigned_short>(&local_b0);
          if (uVar1 < *(ushort *)(local_178.data + iVar3 * 2)) {
            pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_198,
                       "Statistics mismatch: value is bigger than max.\nStatistics: %s\nVector: %s",
                       "");
            BaseStatistics::ToString_abi_cxx11_(&local_110,stats);
            Vector::ToString_abi_cxx11_(&local_130,vector,count);
            InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                      (pIVar2,&local_198,&local_110,&local_130);
            __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
      }
      iVar4 = iVar4 + 1;
    } while (count != iVar4);
  }
  Value::~Value(&local_b0);
  Value::~Value(&local_70);
  if (local_178.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_178.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void NumericStats::TemplatedVerify(const BaseStatistics &stats, Vector &vector, const SelectionVector &sel,
                                   idx_t count) {
	UnifiedVectorFormat vdata;
	vector.ToUnifiedFormat(count, vdata);

	auto data = UnifiedVectorFormat::GetData<T>(vdata);
	auto min_value = NumericStats::MinOrNull(stats);
	auto max_value = NumericStats::MaxOrNull(stats);
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		if (!vdata.validity.RowIsValid(index)) {
			continue;
		}
		if (!min_value.IsNull() && LessThan::Operation(data[index], min_value.GetValueUnsafe<T>())) { // LCOV_EXCL_START
			throw InternalException("Statistics mismatch: value is smaller than min.\nStatistics: %s\nVector: %s",
			                        stats.ToString(), vector.ToString(count));
		} // LCOV_EXCL_STOP
		if (!max_value.IsNull() && GreaterThan::Operation(data[index], max_value.GetValueUnsafe<T>())) {
			throw InternalException("Statistics mismatch: value is bigger than max.\nStatistics: %s\nVector: %s",
			                        stats.ToString(), vector.ToString(count));
		}
	}
}